

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_disk.c
# Opt level: O2

void create(archive_entry *ae,char *msg)

{
  int iVar1;
  mode_t mVar2;
  archive *a;
  char *__file;
  uint uVar3;
  stat_conflict st;
  
  a = archive_write_disk_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk.c"
                   ,L'+',(uint)(a != (archive *)0x0),"(ad = archive_write_disk_new()) != NULL",
                   (void *)0x0);
  failure("%s",msg);
  iVar1 = archive_write_header(a,ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk.c"
                      ,L'-',0,"0",(long)iVar1,"archive_write_header(ad, ae)",a);
  iVar1 = archive_write_finish_entry(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk.c"
                      ,L'.',0,"0",(long)iVar1,"archive_write_finish_entry(ad)",a);
  iVar1 = archive_write_free(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk.c"
                      ,L'/',0,"0",(long)iVar1,"archive_write_free(ad)",(void *)0x0);
  __file = archive_entry_pathname(ae);
  iVar1 = stat(__file,(stat *)&st);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk.c"
                   ,L'2',(uint)(iVar1 == 0),"0 == stat(archive_entry_pathname(ae), &st)",(void *)0x0
                  );
  failure("%s",msg);
  mVar2 = archive_entry_filetype(ae);
  uVar3 = st.st_mode & 0x3fbff;
  if (mVar2 != 0x4000) {
    uVar3 = st.st_mode;
  }
  mVar2 = archive_entry_mode(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk.c"
                      ,L';',(ulong)(uVar3 & 0x3ffff),"st.st_mode & MODE_MASK",
                      (ulong)(mVar2 & 0x3ffed),"archive_entry_mode(ae) & ~UMASK & MODE_MASK",
                      (void *)0x0);
  return;
}

Assistant:

static void create(struct archive_entry *ae, const char *msg)
{
	struct archive *ad;
	struct stat st;

	/* Write the entry to disk. */
	assert((ad = archive_write_disk_new()) != NULL);
	failure("%s", msg);
	assertEqualIntA(ad, 0, archive_write_header(ad, ae));
	assertEqualIntA(ad, 0, archive_write_finish_entry(ad));
	assertEqualInt(0, archive_write_free(ad));

	/* Test the entries on disk. */
	assert(0 == stat(archive_entry_pathname(ae), &st));
	failure("%s", msg);

#if !defined(_WIN32) || defined(__CYGWIN__)
	/* When verifying a dir, ignore the S_ISGID bit, as some systems set
	 * that automatically. */
	if (archive_entry_filetype(ae) == AE_IFDIR)
		st.st_mode &= ~S_ISGID;
	assertEqualInt(st.st_mode & MODE_MASK,
	    archive_entry_mode(ae) & ~UMASK & MODE_MASK);
#endif
}